

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

void __thiscall MatroskaDemuxer::readClose(MatroskaDemuxer *this)

{
  _Elt_pointer ppAVar1;
  AVPacket *pAVar2;
  uint8_t *puVar3;
  Track *pTVar4;
  int i;
  long lVar5;
  
  if (this->writing_app != (char *)0x0) {
    operator_delete__(this->writing_app);
  }
  if (this->muxing_app != (char *)0x0) {
    operator_delete__(this->muxing_app);
  }
  while (ppAVar1 = (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur,
        (this->packets).c.super__Deque_base<AVPacket_*,_std::allocator<AVPacket_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != ppAVar1) {
    pAVar2 = *ppAVar1;
    puVar3 = pAVar2->data;
    if (puVar3 != (uint8_t *)0x0) {
      operator_delete__(puVar3);
    }
    operator_delete(pAVar2,0x50);
    std::deque<AVPacket_*,_std::allocator<AVPacket_*>_>::pop_front(&(this->packets).c);
  }
  for (lVar5 = 0; lVar5 < (this->super_IOContextDemuxer).num_tracks; lVar5 = lVar5 + 1) {
    pTVar4 = (this->super_IOContextDemuxer).tracks[lVar5];
    if (pTVar4 != (Track *)0x0) {
      operator_delete__(pTVar4);
    }
  }
  return;
}

Assistant:

void MatroskaDemuxer::readClose()
{
    delete[] writing_app;
    delete[] muxing_app;
    while (!packets.empty())
    {
        const AVPacket *pkt = packets.front();
        delete[] pkt->data;
        delete pkt;
        packets.pop();
    }
    for (int i = 0; i < num_tracks; i++) delete[] reinterpret_cast<char *>(tracks[i]);
}